

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

void __thiscall Diligent::RefCountersImpl::~RefCountersImpl(RefCountersImpl *this)

{
  string msg;
  string local_20;
  
  if (((this->m_NumStrongReferences).super___atomic_base<int>._M_i != 0) ||
     ((this->m_NumWeakReferences).super___atomic_base<int>._M_i != 0)) {
    FormatString<char[65]>
              (&local_20,
               (char (*) [65])"There exist outstanding references to the object being destroyed");
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"~RefCountersImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x1cb);
    std::__cxx11::string::~string((string *)&local_20);
  }
  return;
}

Assistant:

~RefCountersImpl()
    {
        VERIFY(m_NumStrongReferences.load() == 0 && m_NumWeakReferences.load() == 0,
               "There exist outstanding references to the object being destroyed");
    }